

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O1

void __thiscall
basisu::basisu_frontend::compute_selector_clusters_within_each_parent_cluster(basisu_frontend *this)

{
  vector<basisu::vector<unsigned_int>_> *this_00;
  byte bVar1;
  uint32_t min_new_capacity;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  uint *puVar6;
  vector<unsigned_int> *pvVar7;
  ulong uVar8;
  char *__function;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint32_t new_size;
  uint32_t cluster_index;
  uint_vec block_selector_cluster_indices;
  uint local_4c;
  elemental_vector local_48;
  vector<basisu::vector<unsigned_int>_> *local_38;
  
  min_new_capacity = this->m_total_blocks;
  local_48.m_p = (void *)0x0;
  local_48.m_size = 0;
  local_48.m_capacity = 0;
  if (min_new_capacity != 0) {
    elemental_vector::increase_capacity
              (&local_48,min_new_capacity,min_new_capacity == 1,4,(object_mover)0x0,false);
    memset((void *)((local_48._8_8_ & 0xffffffff) * 4 + (long)local_48.m_p),0,
           (ulong)(min_new_capacity - local_48.m_size) << 2);
    local_48.m_size = min_new_capacity;
  }
  uVar11 = (this->m_selector_cluster_block_indices).m_size;
  uVar8 = (ulong)uVar11;
  if (0 < (int)uVar11) {
    uVar5 = 0;
    do {
      if ((uVar8 & 0xffffffff) <= uVar5) goto LAB_002350a8;
      pvVar7 = (this->m_selector_cluster_block_indices).m_p;
      if (pvVar7[uVar5].m_size != 0) {
        pvVar7 = pvVar7 + uVar5;
        lVar9 = 0;
        do {
          uVar11 = pvVar7->m_p[lVar9];
          if (local_48.m_size <= uVar11) goto LAB_00235089;
          *(int *)((long)local_48.m_p + (ulong)uVar11 * 4) = (int)uVar5;
          lVar9 = lVar9 + 1;
        } while ((uint)lVar9 < pvVar7->m_size);
      }
      uVar5 = uVar5 + 1;
      uVar8 = (ulong)(int)(this->m_selector_cluster_block_indices).m_size;
    } while ((long)uVar5 < (long)uVar8);
  }
  this_00 = &this->m_selector_clusters_within_each_parent_cluster;
  uVar8 = (ulong)(this->m_selector_clusters_within_each_parent_cluster).m_size;
  if (uVar8 != 0) {
    pvVar7 = this_00->m_p;
    lVar9 = 0;
    do {
      pvVar3 = *(void **)((long)&pvVar7->m_p + lVar9);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
      }
      lVar9 = lVar9 + 0x10;
    } while (uVar8 << 4 != lVar9);
    (this->m_selector_clusters_within_each_parent_cluster).m_size = 0;
  }
  uVar11 = (this->m_selector_parent_cluster_block_indices).m_size;
  uVar2 = (this->m_selector_clusters_within_each_parent_cluster).m_size;
  uVar10 = uVar2 - uVar11;
  if (uVar10 != 0) {
    if (uVar2 < uVar11 || uVar10 == 0) {
      if ((this->m_selector_clusters_within_each_parent_cluster).m_capacity < uVar11) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar11,uVar2 + 1 == uVar11,0x10,(object_mover)0x0,
                   false);
      }
      uVar2 = (this->m_selector_clusters_within_each_parent_cluster).m_size;
      if (uVar11 != uVar2) {
        memset(this_00->m_p + uVar2,0,(ulong)(uVar11 - uVar2) << 4);
      }
    }
    else {
      pvVar7 = this_00->m_p;
      lVar9 = 0;
      do {
        pvVar3 = *(void **)((long)&pvVar7[uVar11].m_p + lVar9);
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
        }
        lVar9 = lVar9 + 0x10;
      } while ((ulong)uVar10 << 4 != lVar9);
    }
    (this->m_selector_clusters_within_each_parent_cluster).m_size = uVar11;
  }
  if (this->m_total_blocks != 0) {
    lVar9 = 0;
    do {
      if (local_48.m_size <= (uint)lVar9) goto LAB_00235089;
      local_4c = *(uint *)((long)local_48.m_p + lVar9 * 4);
      if ((this->m_block_parent_selector_cluster).m_size <= (uint)lVar9) {
        __function = "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]";
        goto LAB_0023509e;
      }
      bVar1 = (this->m_block_parent_selector_cluster).m_p[lVar9];
      if ((this->m_selector_clusters_within_each_parent_cluster).m_size <= (uint)bVar1)
      goto LAB_002350a8;
      pvVar7 = this_00->m_p;
      puVar6 = pvVar7[bVar1].m_p;
      uVar11 = pvVar7[bVar1].m_size;
      if (&local_4c < puVar6 + uVar11 && (puVar6 <= &local_4c && puVar6 != (uint *)0x0)) {
        __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x267,
                      "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]");
      }
      pvVar7 = pvVar7 + bVar1;
      if (pvVar7->m_capacity <= uVar11) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar7,uVar11 + 1,true,4,(object_mover)0x0,false);
      }
      pvVar7->m_p[pvVar7->m_size] = local_4c;
      pvVar7->m_size = pvVar7->m_size + 1;
      lVar9 = lVar9 + 1;
    } while ((uint)lVar9 < this->m_total_blocks);
  }
  local_38 = this_00;
  if ((this->m_selector_clusters_within_each_parent_cluster).m_size != 0) {
    lVar9 = 0;
    uVar11 = 0;
    do {
      uVar2 = *(uint *)((long)&local_38->m_p->m_size + lVar9);
      uVar8 = (ulong)uVar2;
      if (uVar8 == 0) {
        error_printf("basisu_frontend: verify check failed at line %i!\n",0x888);
        abort();
      }
      pvVar7 = (vector<unsigned_int> *)((long)&local_38->m_p->m_p + lVar9);
      puVar6 = pvVar7->m_p;
      lVar4 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar2 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar6,puVar6 + uVar8,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar6,puVar6 + uVar8);
      puVar6 = std::__unique<unsigned_int*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         (pvVar7->m_p,pvVar7->m_p + pvVar7->m_size);
      vector<unsigned_int>::erase(pvVar7,puVar6,pvVar7->m_p + pvVar7->m_size);
      uVar11 = uVar11 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar11 < (this->m_selector_clusters_within_each_parent_cluster).m_size);
  }
  if (local_48.m_p != (void *)0x0) {
    free(local_48.m_p);
  }
  return;
LAB_00235089:
  __function = "T &basisu::vector<unsigned int>::operator[](size_t) [T = unsigned int]";
  goto LAB_0023509e;
LAB_002350a8:
  __function = 
  "T &basisu::vector<basisu::vector<unsigned int>>::operator[](size_t) [T = basisu::vector<unsigned int>]"
  ;
LAB_0023509e:
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x178,__function);
}

Assistant:

void basisu_frontend::compute_selector_clusters_within_each_parent_cluster()
	{
		uint_vec block_selector_cluster_indices(m_total_blocks);

		for (int cluster_index = 0; cluster_index < static_cast<int>(m_selector_cluster_block_indices.size()); cluster_index++)
		{
			const basisu::vector<uint32_t>& cluster_indices = m_selector_cluster_block_indices[cluster_index];

			for (uint32_t cluster_indices_iter = 0; cluster_indices_iter < cluster_indices.size(); cluster_indices_iter++)
			{
				const uint32_t block_index = cluster_indices[cluster_indices_iter];
				
				block_selector_cluster_indices[block_index] = cluster_index;

			} // cluster_indices_iter

		} // cluster_index

		m_selector_clusters_within_each_parent_cluster.resize(0);
		m_selector_clusters_within_each_parent_cluster.resize(m_selector_parent_cluster_block_indices.size());

		for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
		{
			const uint32_t cluster_index = block_selector_cluster_indices[block_index];
			const uint32_t parent_cluster_index = m_block_parent_selector_cluster[block_index];

			m_selector_clusters_within_each_parent_cluster[parent_cluster_index].push_back(cluster_index);
		}

		for (uint32_t i = 0; i < m_selector_clusters_within_each_parent_cluster.size(); i++)
		{
			uint_vec &cluster_indices = m_selector_clusters_within_each_parent_cluster[i];

			BASISU_FRONTEND_VERIFY(cluster_indices.size());

			vector_sort(cluster_indices);
			
			auto last = std::unique(cluster_indices.begin(), cluster_indices.end());
			cluster_indices.erase(last, cluster_indices.end());
		}
	}